

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

_Bool get_token(HttpProxyNegotiator *s)

{
  byte val;
  strbuf *psVar1;
  ulong uVar2;
  _Bool _Var3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  psVar1 = s->header;
  uVar5 = s->header_pos;
  uVar2 = psVar1->len;
  uVar4 = uVar2;
  if (uVar2 < uVar5) {
    uVar4 = uVar5;
  }
  while (((uVar6 = uVar4, uVar5 < uVar2 && (uVar6 = uVar5, (ulong)(byte)psVar1->s[uVar5] < 0x21)) &&
         ((0x100000600U >> ((ulong)(byte)psVar1->s[uVar5] & 0x3f) & 1) != 0))) {
    uVar5 = uVar5 + 1;
  }
  if ((uVar6 == uVar2) || (_Var3 = is_separator(psVar1->s[uVar6]), _Var3)) {
    _Var3 = false;
  }
  else {
    strbuf_clear(s->token);
    for (; uVar6 < s->header->len; uVar6 = uVar6 + 1) {
      val = s->header->s[uVar6];
      if ((((ulong)val < 0x21) && ((0x100000600U >> ((ulong)val & 0x3f) & 1) != 0)) ||
         (_Var3 = is_separator(val), _Var3)) break;
      BinarySink_put_byte(s->token->binarysink_,val);
    }
    s->header_pos = uVar6;
    _Var3 = true;
  }
  return _Var3;
}

Assistant:

static bool get_token(HttpProxyNegotiator *s)
{
    size_t pos = s->header_pos;

    while (pos < s->header->len && is_whitespace(s->header->s[pos]))
        pos++;

    if (pos == s->header->len)
        return false;                  /* end of string */

    if (is_separator(s->header->s[pos]))
        return false;

    strbuf_clear(s->token);
    while (pos < s->header->len &&
           !is_whitespace(s->header->s[pos]) &&
           !is_separator(s->header->s[pos]))
        put_byte(s->token, s->header->s[pos++]);

    s->header_pos = pos;
    return true;
}